

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O3

void __thiscall cmLocalGenerator::GenerateTestFiles(cmLocalGenerator *this)

{
  cmStateSnapshot *this_00;
  pointer pcVar1;
  pointer puVar2;
  bool bVar3;
  string *psVar4;
  ostream *poVar5;
  cmValue cVar6;
  cmValue cVar7;
  string *i;
  cmOutputConverter *pcVar8;
  pointer puVar9;
  cmMakefile *pcVar10;
  WrapQuotes in_R8D;
  undefined8 uVar11;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  string_view str;
  string_view str_00;
  string_view str_01;
  cmList includesList;
  string resourceSpecFile;
  string file;
  string config;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configurationTypes;
  cmGeneratedFileStream fout;
  undefined1 local_380 [16];
  undefined1 local_370 [32];
  undefined1 local_350 [32];
  undefined1 local_330 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_308;
  long local_2f8;
  string local_2f0;
  string local_2d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2b0;
  undefined1 local_298 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  char *local_278;
  undefined8 local_270;
  
  pcVar10 = this->Makefile;
  local_370._24_8_ = this;
  local_298._0_8_ = &local_288;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"CMAKE_TESTING_ENABLED","");
  bVar3 = cmMakefile::IsOn(pcVar10,(string *)local_298);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._0_8_ != &local_288) {
    operator_delete((void *)local_298._0_8_,local_288._M_allocated_capacity + 1);
  }
  uVar11 = local_370._24_8_;
  if (!bVar3) {
    return;
  }
  cmMakefile::GetGeneratorConfigs_abi_cxx11_
            (&local_2b0,*(cmMakefile **)(local_370._24_8_ + 0x70),OnlyMultiConfig);
  cmMakefile::GetDefaultConfiguration_abi_cxx11_(&local_2d0,*(cmMakefile **)(uVar11 + 0x70));
  this_00 = &((cmOutputConverter *)uVar11)->StateSnapshot;
  cmStateSnapshot::GetDirectory((cmStateDirectory *)local_380,this_00);
  psVar4 = cmStateDirectory::GetCurrentBinary_abi_cxx11_((cmStateDirectory *)local_380);
  local_298._8_8_ = (psVar4->_M_dataplus)._M_p;
  local_298._0_8_ = psVar4->_M_string_length;
  local_288._M_allocated_capacity = 0;
  local_288._8_8_ = 0x14;
  local_278 = "/CTestTestfile.cmake";
  local_270 = 0;
  views._M_len = 2;
  views._M_array = (iterator)local_298;
  cmCatViews(&local_2f0,views);
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_298,&local_2f0,false,None);
  cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)local_298,true);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_298,"# CMake generated Testfile for \n# Source directory: ",0x34);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)local_380,this_00);
  psVar4 = cmStateDirectory::GetCurrentSource_abi_cxx11_((cmStateDirectory *)local_380);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_298,(psVar4->_M_dataplus)._M_p,psVar4->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n# Build directory: ",0x14);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)local_330,this_00);
  psVar4 = cmStateDirectory::GetCurrentBinary_abi_cxx11_((cmStateDirectory *)local_330);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,(psVar4->_M_dataplus)._M_p,psVar4->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,
             "\n# \n# This file includes the relevant testing commands required for \n# testing this directory and lists subdirectories to be tested as well.\n"
             ,0x8d);
  pcVar10 = *(cmMakefile **)(local_370._24_8_ + 0x70);
  local_380._0_8_ = local_370;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_380,"CTEST_RESOURCE_SPEC_FILE","")
  ;
  psVar4 = cmMakefile::GetSafeDefinition(pcVar10,(string *)local_380);
  local_330._0_8_ = local_330 + 0x10;
  pcVar1 = (psVar4->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_330,pcVar1,pcVar1 + psVar4->_M_string_length);
  if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_380._0_8_ !=
      (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_370) {
    operator_delete((void *)local_380._0_8_,(ulong)(local_370._0_8_ + 1));
  }
  if (local_330._8_8_ != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_298,"set(CTEST_RESOURCE_SPEC_FILE \"",0x1e);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_298,(char *)local_330._0_8_,local_330._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\")\n",3);
  }
  pcVar10 = *(cmMakefile **)(local_370._24_8_ + 0x70);
  local_380._0_8_ = local_370;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_380,"TEST_INCLUDE_FILE","");
  cVar6 = cmMakefile::GetProperty(pcVar10,(string *)local_380);
  if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_380._0_8_ !=
      (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_370) {
    operator_delete((void *)local_380._0_8_,(ulong)(local_370._0_8_ + 1));
  }
  if (cVar6.Value != (string *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_298,"include(\"",9);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_298,((cVar6.Value)->_M_dataplus)._M_p,
                        (cVar6.Value)->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\")\n",3);
  }
  pcVar10 = *(cmMakefile **)(local_370._24_8_ + 0x70);
  local_380._0_8_ = local_370;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_380,"TEST_INCLUDE_FILES","");
  cVar6 = cmMakefile::GetProperty(pcVar10,(string *)local_380);
  if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_380._0_8_ !=
      (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_370) {
    operator_delete((void *)local_380._0_8_,(ulong)(local_370._0_8_ + 1));
  }
  if (cVar6.Value != (string *)0x0) {
    local_380._0_8_ = local_370;
    pcVar1 = ((cVar6.Value)->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_380,pcVar1,pcVar1 + (cVar6.Value)->_M_string_length);
    init._M_len = 1;
    init._M_array = (iterator)local_380;
    cmList::cmList((cmList *)local_350,init);
    if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_380._0_8_ !=
        (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_370) {
      operator_delete((void *)local_380._0_8_,(ulong)(local_370._0_8_ + 1));
    }
    uVar11 = local_350._8_8_;
    if (local_350._0_8_ != local_350._8_8_) {
      pcVar8 = (cmOutputConverter *)local_350._0_8_;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_298,"include(\"",9);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_298,(char *)pcVar8->_vptr_cmOutputConverter,
                            (long)(pcVar8->StateSnapshot).State);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\")\n",3);
        pcVar8 = (cmOutputConverter *)&pcVar8->LinkScriptShell;
      } while (pcVar8 != (cmOutputConverter *)uVar11);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_350);
  }
  pcVar10 = *(cmMakefile **)(local_370._24_8_ + 0x70);
  puVar9 = (pcVar10->TestGenerators).
           super__Vector_base<std::unique_ptr<cmTestGenerator,_std::default_delete<cmTestGenerator>_>,_std::allocator<std::unique_ptr<cmTestGenerator,_std::default_delete<cmTestGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (pcVar10->TestGenerators).
           super__Vector_base<std::unique_ptr<cmTestGenerator,_std::default_delete<cmTestGenerator>_>,_std::allocator<std::unique_ptr<cmTestGenerator,_std::default_delete<cmTestGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar9 != puVar2) {
    do {
      cmTestGenerator::Compute
                ((puVar9->_M_t).
                 super___uniq_ptr_impl<cmTestGenerator,_std::default_delete<cmTestGenerator>_>._M_t.
                 super__Tuple_impl<0UL,_cmTestGenerator_*,_std::default_delete<cmTestGenerator>_>.
                 super__Head_base<0UL,_cmTestGenerator_*,_false>._M_head_impl,
                 (cmLocalGenerator *)local_370._24_8_);
      cmScriptGenerator::Generate
                (&((puVar9->_M_t).
                   super___uniq_ptr_impl<cmTestGenerator,_std::default_delete<cmTestGenerator>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_cmTestGenerator_*,_std::default_delete<cmTestGenerator>_>.
                   super__Head_base<0UL,_cmTestGenerator_*,_false>._M_head_impl)->
                  super_cmScriptGenerator,(ostream *)local_298,&local_2d0,&local_2b0);
      puVar9 = puVar9 + 1;
    } while (puVar9 != puVar2);
    pcVar10 = *(cmMakefile **)(local_370._24_8_ + 0x70);
  }
  cmMakefile::GetStateSnapshot(pcVar10);
  cmStateSnapshot::GetChildren
            ((vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> *)&local_308,
             (cmStateSnapshot *)local_380);
  if (local_308._M_allocated_capacity != local_308._8_8_) {
    uVar11 = local_308._M_allocated_capacity;
    do {
      cmStateSnapshot::GetDirectory((cmStateDirectory *)local_380,(cmStateSnapshot *)uVar11);
      psVar4 = cmStateDirectory::GetCurrentBinary_abi_cxx11_((cmStateDirectory *)local_380);
      pcVar1 = (psVar4->_M_dataplus)._M_p;
      local_350._0_8_ = (cmOutputConverter *)(local_350 + 0x10);
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_350,pcVar1,pcVar1 + psVar4->_M_string_length);
      cmOutputConverter::MaybeRelativeToCurBinDir
                ((string *)local_380,(cmOutputConverter *)local_370._24_8_,(string *)local_350);
      std::__cxx11::string::operator=((string *)local_350,(string *)local_380);
      if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_380._0_8_ !=
          (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_370) {
        operator_delete((void *)local_380._0_8_,(ulong)(local_370._0_8_ + 1));
      }
      str._M_str = (char *)0x0;
      str._M_len = local_350._0_8_;
      cmOutputConverter::EscapeForCMake_abi_cxx11_
                ((string *)local_380,(cmOutputConverter *)local_350._8_8_,str,in_R8D);
      std::__cxx11::string::operator=((string *)local_350,(string *)local_380);
      if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_380._0_8_ !=
          (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_370) {
        operator_delete((void *)local_380._0_8_,(ulong)(local_370._0_8_ + 1));
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_298,"subdirs(",8);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_298,(char *)local_350._0_8_,local_350._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,")\n",2);
      if ((cmOutputConverter *)local_350._0_8_ != (cmOutputConverter *)(local_350 + 0x10)) {
        operator_delete((void *)local_350._0_8_,(ulong)(local_350._16_8_ + 1));
      }
      uVar11 = uVar11 + 0x18;
    } while (uVar11 != local_308._8_8_);
  }
  pcVar10 = *(cmMakefile **)(local_370._24_8_ + 0x70);
  local_380._0_8_ = local_370;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_380,"CMAKE_DIRECTORY_LABELS","");
  cVar6 = cmMakefile::GetDefinition(pcVar10,(string *)local_380);
  if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_380._0_8_ !=
      (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_370) {
    operator_delete((void *)local_380._0_8_,(ulong)(local_370._0_8_ + 1));
  }
  pcVar10 = *(cmMakefile **)(local_370._24_8_ + 0x70);
  local_380._0_8_ = local_370;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_380,"LABELS","");
  cVar7 = cmMakefile::GetProperty(pcVar10,(string *)local_380);
  if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_380._0_8_ !=
      (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_370) {
    operator_delete((void *)local_380._0_8_,(ulong)(local_370._0_8_ + 1));
  }
  if (cVar7.Value == (string *)0x0 && cVar6.Value == (string *)0x0) goto LAB_001bc281;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_298,"set_directory_properties(PROPERTIES LABELS ",0x2b);
  if (cVar7.Value == (string *)0x0) {
    if (cVar6.Value != (string *)0x0) goto LAB_001bc222;
  }
  else {
    str_00._M_str = (char *)0x0;
    str_00._M_len = (size_t)((cVar7.Value)->_M_dataplus)._M_p;
    cmOutputConverter::EscapeForCMake_abi_cxx11_
              ((string *)local_380,(cmOutputConverter *)(cVar7.Value)->_M_string_length,str_00,
               in_R8D);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_298,(char *)local_380._0_8_,local_380._8_8_);
    if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_380._0_8_ !=
        (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_370) {
      operator_delete((void *)local_380._0_8_,(ulong)(local_370._0_8_ + 1));
    }
    if (cVar6.Value != (string *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_298,";",1);
LAB_001bc222:
      str_01._M_str = (char *)0x0;
      str_01._M_len = (size_t)((cVar6.Value)->_M_dataplus)._M_p;
      cmOutputConverter::EscapeForCMake_abi_cxx11_
                ((string *)local_380,(cmOutputConverter *)(cVar6.Value)->_M_string_length,str_01,
                 in_R8D);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_298,(char *)local_380._0_8_,local_380._8_8_);
      if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_380._0_8_ !=
          (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_370) {
        operator_delete((void *)local_380._0_8_,(ulong)(local_370._0_8_ + 1));
      }
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_298,")\n",2);
LAB_001bc281:
  if ((cmStateSnapshot *)local_308._M_allocated_capacity != (cmStateSnapshot *)0x0) {
    operator_delete((void *)local_308._M_allocated_capacity,local_2f8 - local_308._0_8_);
  }
  if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_330._0_8_ !=
      (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)(local_330 + 0x10)) {
    operator_delete((void *)local_330._0_8_,
                    (ulong)&(((cmPropertyDefinitionMap *)local_330._16_8_)->Map_)._M_t._M_impl.
                            field_0x1);
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_298);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2b0);
  return;
}

Assistant:

void cmLocalGenerator::GenerateTestFiles()
{
  if (!this->Makefile->IsOn("CMAKE_TESTING_ENABLED")) {
    return;
  }

  // Compute the set of configurations.
  std::vector<std::string> configurationTypes =
    this->Makefile->GetGeneratorConfigs(cmMakefile::OnlyMultiConfig);
  std::string config = this->Makefile->GetDefaultConfiguration();

  std::string file =
    cmStrCat(this->StateSnapshot.GetDirectory().GetCurrentBinary(),
             "/CTestTestfile.cmake");

  cmGeneratedFileStream fout(file);
  fout.SetCopyIfDifferent(true);

  fout << "# CMake generated Testfile for \n"
          "# Source directory: "
       << this->StateSnapshot.GetDirectory().GetCurrentSource()
       << "\n"
          "# Build directory: "
       << this->StateSnapshot.GetDirectory().GetCurrentBinary()
       << "\n"
          "# \n"
          "# This file includes the relevant testing commands "
          "required for \n"
          "# testing this directory and lists subdirectories to "
          "be tested as well.\n";

  std::string resourceSpecFile =
    this->Makefile->GetSafeDefinition("CTEST_RESOURCE_SPEC_FILE");
  if (!resourceSpecFile.empty()) {
    fout << "set(CTEST_RESOURCE_SPEC_FILE \"" << resourceSpecFile << "\")\n";
  }

  cmValue testIncludeFile = this->Makefile->GetProperty("TEST_INCLUDE_FILE");
  if (testIncludeFile) {
    fout << "include(\"" << *testIncludeFile << "\")\n";
  }

  cmValue testIncludeFiles = this->Makefile->GetProperty("TEST_INCLUDE_FILES");
  if (testIncludeFiles) {
    cmList includesList{ *testIncludeFiles };
    for (std::string const& i : includesList) {
      fout << "include(\"" << i << "\")\n";
    }
  }

  // Ask each test generator to write its code.
  for (const auto& tester : this->Makefile->GetTestGenerators()) {
    tester->Compute(this);
    tester->Generate(fout, config, configurationTypes);
  }
  using vec_t = std::vector<cmStateSnapshot>;
  vec_t const& children = this->Makefile->GetStateSnapshot().GetChildren();
  for (cmStateSnapshot const& i : children) {
    // TODO: Use add_subdirectory instead?
    std::string outP = i.GetDirectory().GetCurrentBinary();
    outP = this->MaybeRelativeToCurBinDir(outP);
    outP = cmOutputConverter::EscapeForCMake(outP);
    fout << "subdirs(" << outP << ")\n";
  }

  // Add directory labels property
  cmValue directoryLabels =
    this->Makefile->GetDefinition("CMAKE_DIRECTORY_LABELS");
  cmValue labels = this->Makefile->GetProperty("LABELS");

  if (labels || directoryLabels) {
    fout << "set_directory_properties(PROPERTIES LABELS ";
    if (labels) {
      fout << cmOutputConverter::EscapeForCMake(*labels);
    }
    if (labels && directoryLabels) {
      fout << ";";
    }
    if (directoryLabels) {
      fout << cmOutputConverter::EscapeForCMake(*directoryLabels);
    }
    fout << ")\n";
  }
}